

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_14c80dc::ParsedArguments::apply(ParsedArguments *this,Struct *reflectable)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  string property;
  string local_58;
  _Rb_tree_node_base *local_38;
  
  p_Var2 = (this->selections)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_38 = &(this->selections)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var2 != local_38) {
    do {
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      local_58._M_string_length = 0;
      local_58.field_2._M_local_buf[0] = '\0';
      p_Var1 = p_Var2[1]._M_parent;
      if (p_Var1 != (_Base_ptr)0x0) {
        p_Var3 = (_Base_ptr)0x0;
        do {
          std::__cxx11::string::push_back((char)&local_58);
          p_Var3 = (_Base_ptr)((long)&p_Var3->_M_color + 1);
        } while (p_Var1 != p_Var3);
      }
      if (p_Var2[2]._M_parent == (_Base_ptr)0x0) {
        Reflection::set<bool>(reflectable,&local_58,true,0);
      }
      else {
        Reflection::fuzzy_set(reflectable,&local_58,(string *)(p_Var2 + 2));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,
                        CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                 local_58.field_2._M_local_buf[0]) + 1);
      }
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while (p_Var2 != local_38);
  }
  return;
}

Assistant:

void apply(Reflection::Struct *reflectable) const {
		for(const auto &argument: selections) {
			// Replace any dashes with underscores in the argument name.
			std::string property;
			std::transform(argument.first.begin(), argument.first.end(), std::back_inserter(property), [](char c) { return c == '-' ? '_' : c; });

			if(argument.second.empty()) {
				Reflection::set<bool>(*reflectable, property, true);
			} else {
				Reflection::fuzzy_set(*reflectable, property, argument.second);
			}
		}
	}